

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit,_int> *ps)

{
  bool bVar1;
  Size SVar2;
  Size SVar3;
  int iVar4;
  Lit LVar5;
  Clause *this_00;
  int *piVar6;
  char *pcVar7;
  vec<Minisat::Lit,_int> *in_RDI;
  int i;
  Clause *c;
  CRef cr;
  int nclauses;
  undefined4 in_stack_ffffffffffffff78;
  CRef in_stack_ffffffffffffff7c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *in_stack_ffffffffffffff80;
  Size *this_01;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar8;
  int i_00;
  Solver *in_stack_ffffffffffffffd8;
  bool local_1;
  
  SVar2 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)&in_RDI[0x11].sz);
  if ((((ulong)in_RDI[0x37].data & 0x100) == 0) ||
     (bVar1 = implied((SimpSolver *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_RDI), !bVar1)) {
    bVar1 = Solver::addClause_(in_stack_ffffffffffffffd8,
                               (vec<Minisat::Lit,_int> *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (bVar1) {
      if ((((ulong)in_RDI[0x38].data & 0x100000000) != 0) &&
         (SVar3 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)&in_RDI[0x11].sz),
         SVar3 == SVar2 + 1)) {
        vec<unsigned_int,_int>::last((vec<unsigned_int,_int> *)&in_RDI[0x11].sz);
        this_00 = ClauseAllocator::operator[]
                            ((ClauseAllocator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c)
        ;
        Queue<unsigned_int>::insert
                  ((Queue<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
        iVar8 = 0;
        while (i_00 = iVar8, iVar4 = Clause::size(this_00), iVar8 < iVar4) {
          this_01 = &in_RDI[0x3b].sz;
          LVar5 = Clause::operator[](this_00,i_00);
          Minisat::var(LVar5);
          OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
          ::operator[](in_stack_ffffffffffffff80,
                       (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          vec<unsigned_int,_int>::push
                    ((vec<unsigned_int,_int> *)in_stack_ffffffffffffff80,
                     (uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          LVar5.x = (int)((ulong)(in_RDI + 0x40) >> 0x20);
          Clause::operator[](this_00,i_00);
          piVar6 = IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::operator[]
                             ((IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit> *)this_01,LVar5);
          *piVar6 = *piVar6 + 1;
          LVar5 = Clause::operator[](this_00,i_00);
          Minisat::var(LVar5);
          pcVar7 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             ((IntMap<int,_char,_Minisat::MkIndexDefault<int>_> *)
                              in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          *pcVar7 = '\x01';
          *(int *)((long)&in_RDI[0x4a].data + 4) = *(int *)((long)&in_RDI[0x4a].data + 4) + 1;
          LVar5 = Clause::operator[](this_00,i_00);
          Minisat::var(LVar5);
          bVar1 = Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::inHeap
                            ((Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>
                              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          if (bVar1) {
            in_stack_ffffffffffffff80 =
                 (OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                  *)&in_RDI[0x41].sz;
            LVar5 = Clause::operator[](this_00,i_00);
            Minisat::var(LVar5);
            Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::increase
                      ((Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *)
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          }
          iVar8 = i_00 + 1;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[c[i]]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}